

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
diligent_spirv_cross::Compiler::is_hidden_variable
          (Compiler *this,SPIRVariable *var,bool include_builtins)

{
  bool bVar1;
  uint32_t uVar2;
  CombinedImageSampler *pCVar3;
  CombinedImageSampler *pCVar4;
  bool local_61;
  _Node_iterator_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_true> local_48;
  key_type local_3c;
  _Node_iterator_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_true> local_38;
  SPIRVariable *local_30;
  byte local_21;
  anon_class_8_1_ba1d8287_for__M_pred aStack_20;
  bool include_builtins_local;
  SPIRVariable *var_local;
  Compiler *this_local;
  
  local_21 = include_builtins;
  aStack_20.var = var;
  var_local = (SPIRVariable *)this;
  bVar1 = is_builtin_variable(this,var);
  if (((bVar1) && ((local_21 & 1) == 0)) || (((aStack_20.var)->remapped_variable & 1U) != 0)) {
    this_local._7_1_ = true;
  }
  else {
    pCVar3 = ::std::
             begin<diligent_spirv_cross::SmallVector<diligent_spirv_cross::CombinedImageSampler,8ul>>
                       (&this->combined_image_samplers);
    pCVar4 = ::std::
             end<diligent_spirv_cross::SmallVector<diligent_spirv_cross::CombinedImageSampler,8ul>>
                       (&this->combined_image_samplers);
    local_30 = aStack_20.var;
    pCVar3 = ::std::
             find_if<diligent_spirv_cross::CombinedImageSampler_const*,diligent_spirv_cross::Compiler::is_hidden_variable(diligent_spirv_cross::SPIRVariable_const&,bool)const::__0>
                       (pCVar3,pCVar4,aStack_20);
    pCVar4 = ::std::
             end<diligent_spirv_cross::SmallVector<diligent_spirv_cross::CombinedImageSampler,8ul>>
                       (&this->combined_image_samplers);
    if (pCVar3 == pCVar4) {
      uVar2 = ParsedIR::get_spirv_version(&this->ir);
      if (((0x103ff < uVar2) && ((aStack_20.var)->storage != Generic)) &&
         ((aStack_20.var)->storage != Function)) {
        uVar2 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&((aStack_20.var)->super_IVariant).self);
        bVar1 = interface_variable_exists_in_entry_point(this,uVar2);
        if (!bVar1) {
          return true;
        }
      }
      local_61 = false;
      if ((this->check_active_interface_variables & 1U) != 0) {
        bVar1 = storage_class_is_interface((aStack_20.var)->storage);
        local_61 = false;
        if (bVar1) {
          local_3c.id = (uint32_t)
                        TypedID::operator_cast_to_TypedID
                                  ((TypedID *)&((aStack_20.var)->super_IVariant).self);
          local_38._M_cur =
               (__node_type *)
               ::std::
               unordered_set<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>_>
               ::find(&this->active_interface_variables,&local_3c);
          local_48._M_cur =
               (__node_type *)
               ::std::
               end<std::unordered_set<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>>>
                         (&this->active_interface_variables);
          local_61 = ::std::__detail::operator==(&local_38,&local_48);
        }
      }
      this_local._7_1_ = local_61;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Compiler::is_hidden_variable(const SPIRVariable &var, bool include_builtins) const
{
	if ((is_builtin_variable(var) && !include_builtins) || var.remapped_variable)
		return true;

	// Combined image samplers are always considered active as they are "magic" variables.
	if (find_if(begin(combined_image_samplers), end(combined_image_samplers), [&var](const CombinedImageSampler &samp) {
		    return samp.combined_id == var.self;
	    }) != end(combined_image_samplers))
	{
		return false;
	}

	// In SPIR-V 1.4 and up we must also use the active variable interface to disable global variables
	// which are not part of the entry point.
	if (ir.get_spirv_version() >= 0x10400 && var.storage != spv::StorageClassGeneric &&
	    var.storage != spv::StorageClassFunction && !interface_variable_exists_in_entry_point(var.self))
	{
		return true;
	}

	return check_active_interface_variables && storage_class_is_interface(var.storage) &&
	       active_interface_variables.find(var.self) == end(active_interface_variables);
}